

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

vector<int,_std::allocator<int>_> * JSON::parseIntArray(string *json)

{
  int iVar1;
  char *pcVar2;
  ulong in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i;
  int curid;
  int n;
  vector<int,_std::allocator<int>_> *res;
  vector<int,_std::allocator<int>_> *this;
  int local_24;
  
  this = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x114355);
  pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
  if (*pcVar2 == '[') {
    iVar1 = std::__cxx11::string::size();
    for (local_24 = 1; local_24 < iVar1; local_24 = local_24 + 1) {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
      if (*pcVar2 != ' ') {
        pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
        if (*pcVar2 == ',') {
          std::vector<int,_std::allocator<int>_>::push_back(this,(value_type_conflict2 *)in_RDI);
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
          if (*pcVar2 == ']') {
            std::vector<int,_std::allocator<int>_>::push_back(this,(value_type_conflict2 *)in_RDI);
            return this;
          }
          std::__cxx11::string::operator[](in_RSI);
        }
      }
    }
  }
  return this;
}

Assistant:

std::vector<int> parseIntArray(const std::string & json) {
    std::vector<int> res;
    if (json[0] != '[') return res;

    int n = json.size();
    int curid = 0;
    for (int i = 1; i < n; ++i) {
        if (json[i] == ' ') continue;
        if (json[i] == ',') {
            res.push_back(curid);
            curid = 0;
            continue;
        }

        if (json[i] == ']') {
            res.push_back(curid);
            break;
        }

        curid = 10*curid + json[i] - 48;
    }

    return res;
}